

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

bool __thiscall Catch::TestSpec::Filter::matches(Filter *this,TestCaseInfo *testCase)

{
  pointer pPVar1;
  pointer pPVar2;
  int iVar3;
  pointer pPVar4;
  
  pPVar1 = (this->m_patterns).
           super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pPVar2 = (this->m_patterns).
           super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    pPVar4 = pPVar2;
    if (pPVar4 == pPVar1) break;
    iVar3 = (*(pPVar4->m_p->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable.
              _vptr_NonCopyable[4])(pPVar4->m_p,testCase);
    pPVar2 = pPVar4 + 1;
  } while ((char)iVar3 != '\0');
  return pPVar4 == pPVar1;
}

Assistant:

bool matches( TestCaseInfo const& testCase ) const {
                // All patterns in a filter must match for the filter to be a match
                for( std::vector<Ptr<Pattern> >::const_iterator it = m_patterns.begin(), itEnd = m_patterns.end(); it != itEnd; ++it )
                    if( !(*it)->matches( testCase ) )
                        return false;
                    return true;
            }